

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall PrimitiveTestClass::~PrimitiveTestClass(PrimitiveTestClass *this)

{
  long *plVar1;
  TestArrObj *pTVar2;
  long lVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  
  if (this->str != (char *)0x0) {
    operator_delete__(this->str);
  }
  if (this->pc != (char *)0x0) {
    operator_delete__(this->pc);
  }
  if (this->puc != (uchar *)0x0) {
    operator_delete__(this->puc);
  }
  if (this->ps != (short *)0x0) {
    operator_delete__(this->ps);
  }
  if (this->pus != (unsigned_short *)0x0) {
    operator_delete__(this->pus);
  }
  if (this->pi != (int *)0x0) {
    operator_delete__(this->pi);
  }
  if (this->pui != (uint *)0x0) {
    operator_delete__(this->pui);
  }
  if (this->pl != (long *)0x0) {
    operator_delete__(this->pl);
  }
  if (this->pul != (unsigned_long *)0x0) {
    operator_delete__(this->pul);
  }
  if (this->pll != (longlong *)0x0) {
    operator_delete__(this->pll);
  }
  if (this->pull != (unsigned_long_long *)0x0) {
    operator_delete__(this->pull);
  }
  if (this->pf != (float *)0x0) {
    operator_delete__(this->pf);
  }
  if (this->pld != (longdouble *)0x0) {
    operator_delete__(this->pld);
  }
  if (this->pd != (double *)0x0) {
    operator_delete__(this->pd);
  }
  pTVar2 = this->pto;
  if (pTVar2 != (TestArrObj *)0x0) {
    lVar3 = *(long *)((long)&pTVar2[-1].str.field_2 + 8);
    if (lVar3 != 0) {
      lVar6 = lVar3 << 5;
      do {
        plVar1 = (long *)((long)pTVar2 + lVar6 + -0x10);
        plVar4 = *(long **)((long)&pTVar2[-1].str._M_dataplus._M_p + lVar6);
        if (plVar1 != plVar4) {
          operator_delete(plVar4,*plVar1 + 1);
        }
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != 0);
    }
    operator_delete__((void *)((long)&pTVar2[-1].str.field_2 + 8),lVar3 << 5 | 8);
  }
  p_Var5 = (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  p_Var5 = (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    return;
  }
  return;
}

Assistant:

~PrimitiveTestClass()
        {
            delete[] str;

            delete[] pc;
            delete[] puc;
            delete[] ps;
            delete[] pus;
            delete[] pi;
            delete[] pui;
            delete[] pl;
            delete[] pul;
            delete[] pll;
            delete[] pull;
            delete[] pf;
            delete[] pld;
            delete[] pd;
            delete[] pto;
        }